

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

void google::protobuf::internal::ExtensionSet::RegisterEnumExtension
               (MessageLite *extendee,int number,FieldType type,bool is_repeated,bool is_packed,
               EnumValidityFunc *is_valid)

{
  LogMessage *other;
  undefined7 in_register_00000011;
  ExtensionInfo info;
  LogMessage local_90;
  undefined1 local_58 [32];
  FieldDescriptor *local_38;
  
  if ((int)CONCAT71(in_register_00000011,type) != 0xe) {
    LogMessage::LogMessage
              (&local_90,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,0xb4);
    other = LogMessage::operator<<
                      (&local_90,"CHECK failed: (type) == (WireFormatLite::TYPE_ENUM): ");
    LogFinisher::operator=((LogFinisher *)local_58,other);
    LogMessage::~LogMessage(&local_90);
  }
  local_38 = (FieldDescriptor *)0x0;
  local_58._16_8_ = CallNoArgValidityFunc;
  local_58._0_8_ = extendee;
  local_58._8_4_ = number;
  local_58[0xc] = type;
  local_58[0xd] = is_repeated;
  local_58[0xe] = is_packed;
  local_58._24_8_ = is_valid;
  anon_unknown_26::Register((ExtensionInfo *)local_58);
  return;
}

Assistant:

void ExtensionSet::RegisterEnumExtension(const MessageLite* extendee,
                                         int number, FieldType type,
                                         bool is_repeated, bool is_packed,
                                         EnumValidityFunc* is_valid) {
  GOOGLE_CHECK_EQ(type, WireFormatLite::TYPE_ENUM);
  ExtensionInfo info(extendee, number, type, is_repeated, is_packed);
  info.enum_validity_check.func = CallNoArgValidityFunc;
  // See comment in CallNoArgValidityFunc() about why we use a c-style cast.
  info.enum_validity_check.arg = (void*)is_valid;
  Register(info);
}